

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  string sStack_78;
  string base;
  string proto_file;
  
  std::__cxx11::string::string((string *)&proto_file,*(string **)this);
  std::__cxx11::string::find_last_of((char *)&proto_file,0x34df86);
  std::__cxx11::string::substr((ulong)&base,(ulong)&proto_file);
  StripDotProto(&sStack_78,&base);
  UnderscoresToPascalCase(__return_storage_ptr__,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::~string((string *)&proto_file);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
    std::string proto_file = descriptor->name();
    int lastslash = proto_file.find_last_of("/");
    std::string base = proto_file.substr(lastslash + 1);
    return UnderscoresToPascalCase(StripDotProto(base));
}